

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyObj.c
# Opt level: O3

Ivy_Obj_t * Ivy_ObjCreate(Ivy_Man_t *p,Ivy_Obj_t *pGhost)

{
  uint *puVar1;
  Ivy_Obj_t *pIVar2;
  Vec_Int_t *pVVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint uVar7;
  uint uVar8;
  Ivy_Obj_t *pIVar9;
  void **ppvVar10;
  int *piVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  int iVar17;
  Vec_Ptr_t *pVVar18;
  int iVar19;
  int iVar21;
  undefined1 auVar20 [16];
  undefined1 auVar22 [16];
  int iVar24;
  undefined1 auVar23 [16];
  
  if (((ulong)pGhost & 1) != 0) {
    __assert_fail("!Ivy_IsComplement(pGhost)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyObj.c"
                  ,0x50,"Ivy_Obj_t *Ivy_ObjCreate(Ivy_Man_t *, Ivy_Obj_t *)");
  }
  if (-1 < pGhost->Id) {
    __assert_fail("Ivy_ObjIsGhost(pGhost)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyObj.c"
                  ,0x51,"Ivy_Obj_t *Ivy_ObjCreate(Ivy_Man_t *, Ivy_Obj_t *)");
  }
  pIVar9 = Ivy_TableLookup(p,pGhost);
  if (pIVar9 != (Ivy_Obj_t *)0x0) {
    __assert_fail("Ivy_TableLookup(p, pGhost) == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyObj.c"
                  ,0x52,"Ivy_Obj_t *Ivy_ObjCreate(Ivy_Man_t *, Ivy_Obj_t *)");
  }
  pIVar9 = p->pListFree;
  if (pIVar9 == (Ivy_Obj_t *)0x0) {
    Ivy_ManAddMemory(p);
    pIVar9 = p->pListFree;
  }
  p->pListFree = *(Ivy_Obj_t **)pIVar9;
  pIVar9->pPrevFan1 = (Ivy_Obj_t *)0x0;
  pIVar9->pEquiv = (Ivy_Obj_t *)0x0;
  pIVar9->pNextFan1 = (Ivy_Obj_t *)0x0;
  pIVar9->pPrevFan0 = (Ivy_Obj_t *)0x0;
  pIVar9->pFanout = (Ivy_Obj_t *)0x0;
  pIVar9->pNextFan0 = (Ivy_Obj_t *)0x0;
  pIVar9->pFanin0 = (Ivy_Obj_t *)0x0;
  pIVar9->pFanin1 = (Ivy_Obj_t *)0x0;
  pIVar9->Id = 0;
  pIVar9->TravId = 0;
  *(undefined4 *)&pIVar9->field_0x8 = 0;
  pIVar9->nRefs = 0;
  pVVar18 = p->vObjs;
  uVar8 = pVVar18->nSize;
  pIVar9->Id = uVar8;
  if (uVar8 == pVVar18->nCap) {
    if ((int)uVar8 < 0x10) {
      if (pVVar18->pArray == (void **)0x0) {
        ppvVar10 = (void **)malloc(0x80);
      }
      else {
        ppvVar10 = (void **)realloc(pVVar18->pArray,0x80);
      }
      pVVar18->pArray = ppvVar10;
      pVVar18->nCap = 0x10;
    }
    else {
      if (pVVar18->pArray == (void **)0x0) {
        ppvVar10 = (void **)malloc((ulong)uVar8 << 4);
      }
      else {
        ppvVar10 = (void **)realloc(pVVar18->pArray,(ulong)uVar8 << 4);
      }
      pVVar18->pArray = ppvVar10;
      pVVar18->nCap = uVar8 * 2;
    }
  }
  else {
    ppvVar10 = pVVar18->pArray;
  }
  iVar21 = pVVar18->nSize;
  pVVar18->nSize = iVar21 + 1;
  ppvVar10[iVar21] = pIVar9;
  uVar7 = *(uint *)&pGhost->field_0x8 & 0xf;
  uVar8 = *(uint *)&pIVar9->field_0x8;
  *(uint *)&pIVar9->field_0x8 = uVar8 & 0xfffffff0 | uVar7;
  *(uint *)&pIVar9->field_0x8 = uVar8 & 0xfffff9f0 | uVar7 | *(uint *)&pGhost->field_0x8 & 0x600;
  Ivy_ObjConnect(p,pIVar9,pGhost->pFanin0,pGhost->pFanin1);
  uVar8 = *(uint *)&pIVar9->field_0x8;
  uVar7 = uVar8 & 0xf;
  if (0xfffffffd < uVar7 - 7) {
    uVar12 = (ulong)pIVar9->pFanin0 & 0xfffffffffffffffe;
    uVar15 = (ulong)pIVar9->pFanin1 & 0xfffffffffffffffe;
    if (*(uint *)(uVar15 + 8) >> 0xb < *(uint *)(uVar12 + 8) >> 0xb) {
      uVar15 = uVar12;
    }
    uVar8 = uVar8 & 0x7ff | *(int *)(uVar15 + 8) + (uint)(uVar7 == 6) * 0x800 + 0x800 & 0xfffff800;
    goto LAB_007a99d9;
  }
  switch(uVar7) {
  case 1:
    goto switchD_007a9976_caseD_1;
  case 2:
  case 3:
  case 7:
    uVar8 = uVar8 & 0x7ff |
            *(uint *)(((ulong)pIVar9->pFanin0 & 0xfffffffffffffffe) + 8) & 0xfffff800;
    break;
  case 4:
    uVar8 = uVar8 & 0x7f4;
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyObj.c"
                  ,0x65,"Ivy_Obj_t *Ivy_ObjCreate(Ivy_Man_t *, Ivy_Obj_t *)");
  }
LAB_007a99d9:
  *(uint *)&pIVar9->field_0x8 = uVar8;
switchD_007a9976_caseD_1:
  uVar7 = uVar8 & 0xf;
  if (uVar7 - 7 < 0xfffffffe) {
    if ((uVar7 < 8) && ((0x9cU >> uVar7 & 1) != 0)) {
      pIVar2 = pIVar9->pFanin0;
      if (((ulong)pIVar2 & 1) == 0) {
        uVar7 = *(uint *)&pIVar2->field_0x8 & 0x80;
      }
      else {
        uVar7 = ~*(uint *)(((ulong)pIVar2 & 0xfffffffffffffffe) + 8) & 0x80;
      }
      goto LAB_007a9a68;
    }
  }
  else {
    pIVar2 = pIVar9->pFanin0;
    if (((ulong)pIVar2 & 1) == 0) {
      uVar7 = *(uint *)&pIVar2->field_0x8;
    }
    else {
      uVar7 = ~*(uint *)(((ulong)pIVar2 & 0xfffffffffffffffe) + 8);
    }
    pIVar2 = pIVar9->pFanin1;
    if (((ulong)pIVar2 & 1) == 0) {
      uVar13 = *(uint *)&pIVar2->field_0x8;
    }
    else {
      uVar13 = ~*(uint *)(((ulong)pIVar2 & 0xfffffffffffffffe) + 8);
    }
    uVar7 = uVar13 & 0x80 & uVar7 & 0x80;
LAB_007a9a68:
    uVar8 = uVar8 & 0xffffff7f | uVar7;
    *(uint *)&pIVar9->field_0x8 = uVar8;
  }
  if (0xfffffffd < (uVar8 & 0xf) - 7) {
    uVar8 = uVar8 & 0xfffffeff |
            (*(uint *)(((ulong)pIVar9->pFanin1 & 0xfffffffffffffffe) + 8) |
            *(uint *)(((ulong)pIVar9->pFanin0 & 0xfffffffffffffffe) + 8)) & 0x100;
    *(uint *)&pIVar9->field_0x8 = uVar8;
  }
  if ((uVar8 & 0xf) == 6) {
    puVar1 = (uint *)(((ulong)pIVar9->pFanin0 & 0xfffffffffffffffe) + 8);
    *puVar1 = *puVar1 | 0x40;
    puVar1 = (uint *)(((ulong)pIVar9->pFanin1 & 0xfffffffffffffffe) + 8);
    *puVar1 = *puVar1 | 0x40;
    uVar8 = *(uint *)&pIVar9->field_0x8;
  }
  if ((uVar8 & 0xf) == 2) {
    pVVar18 = p->vPos;
LAB_007a9ae7:
    uVar8 = pVVar18->nSize;
    if (uVar8 == pVVar18->nCap) {
      if ((int)uVar8 < 0x10) {
        if (pVVar18->pArray == (void **)0x0) {
          ppvVar10 = (void **)malloc(0x80);
        }
        else {
          ppvVar10 = (void **)realloc(pVVar18->pArray,0x80);
        }
        pVVar18->pArray = ppvVar10;
        pVVar18->nCap = 0x10;
      }
      else {
        if (pVVar18->pArray == (void **)0x0) {
          ppvVar10 = (void **)malloc((ulong)uVar8 << 4);
        }
        else {
          ppvVar10 = (void **)realloc(pVVar18->pArray,(ulong)uVar8 << 4);
        }
        pVVar18->pArray = ppvVar10;
        pVVar18->nCap = uVar8 * 2;
      }
    }
    else {
      ppvVar10 = pVVar18->pArray;
    }
    iVar21 = pVVar18->nSize;
    pVVar18->nSize = iVar21 + 1;
    ppvVar10[iVar21] = pIVar9;
  }
  else if ((uVar8 & 0xf) == 1) {
    pVVar18 = p->vPis;
    goto LAB_007a9ae7;
  }
  pVVar3 = p->vRequired;
  if ((pVVar3 == (Vec_Int_t *)0x0) || (iVar21 = pVVar3->nSize, pIVar9->Id < iVar21))
  goto LAB_007a9d21;
  iVar17 = iVar21 * 2;
  if (iVar17 <= iVar21) goto LAB_007a9d21;
  iVar24 = pVVar3->nCap;
  iVar19 = iVar24 * 2;
  if (iVar19 < iVar17) {
    if (pVVar3->pArray == (int *)0x0) {
      piVar11 = (int *)malloc((long)iVar21 << 3);
    }
    else {
      piVar11 = (int *)realloc(pVVar3->pArray,(long)iVar21 << 3);
    }
    pVVar3->pArray = piVar11;
    iVar19 = iVar17;
LAB_007a9bfa:
    if (piVar11 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    pVVar3->nCap = iVar19;
    iVar21 = pVVar3->nSize;
  }
  else if (iVar24 < iVar17) {
    if (pVVar3->pArray == (int *)0x0) {
      piVar11 = (int *)malloc((long)iVar24 << 3);
    }
    else {
      piVar11 = (int *)realloc(pVVar3->pArray,(long)iVar24 << 3);
    }
    pVVar3->pArray = piVar11;
    goto LAB_007a9bfa;
  }
  auVar6 = _DAT_008403e0;
  auVar5 = _DAT_008403d0;
  auVar4 = _DAT_008403c0;
  if (iVar21 < iVar17) {
    piVar11 = pVVar3->pArray;
    lVar14 = (long)iVar21;
    lVar16 = (iVar17 - lVar14) + -1;
    auVar20._8_4_ = (int)lVar16;
    auVar20._0_8_ = lVar16;
    auVar20._12_4_ = (int)((ulong)lVar16 >> 0x20);
    uVar15 = 0;
    auVar20 = auVar20 ^ _DAT_008403e0;
    do {
      auVar22._8_4_ = (int)uVar15;
      auVar22._0_8_ = uVar15;
      auVar22._12_4_ = (int)(uVar15 >> 0x20);
      auVar23 = (auVar22 | auVar5) ^ auVar6;
      iVar21 = auVar20._4_4_;
      if ((bool)(~(auVar23._4_4_ == iVar21 && auVar20._0_4_ < auVar23._0_4_ ||
                  iVar21 < auVar23._4_4_) & 1)) {
        piVar11[lVar14 + uVar15] = 1000000;
      }
      if ((auVar23._12_4_ != auVar20._12_4_ || auVar23._8_4_ <= auVar20._8_4_) &&
          auVar23._12_4_ <= auVar20._12_4_) {
        piVar11[lVar14 + uVar15 + 1] = 1000000;
      }
      auVar22 = (auVar22 | auVar4) ^ auVar6;
      iVar24 = auVar22._4_4_;
      if (iVar24 <= iVar21 && (iVar24 != iVar21 || auVar22._0_4_ <= auVar20._0_4_)) {
        piVar11[lVar14 + uVar15 + 2] = 1000000;
        piVar11[lVar14 + uVar15 + 3] = 1000000;
      }
      uVar15 = uVar15 + 4;
    } while (((iVar17 - lVar14) + 3U & 0xfffffffffffffffc) != uVar15);
  }
  pVVar3->nSize = iVar17;
LAB_007a9d21:
  p->nObjs[*(uint *)&pIVar9->field_0x8 & 0xf] = p->nObjs[*(uint *)&pIVar9->field_0x8 & 0xf] + 1;
  p->nCreated = p->nCreated + 1;
  if (p->pHaig != (Ivy_Man_t *)0x0) {
    Ivy_ManHaigCreateObj(p,pIVar9);
  }
  return pIVar9;
}

Assistant:

Ivy_Obj_t * Ivy_ObjCreate( Ivy_Man_t * p, Ivy_Obj_t * pGhost )
{
    Ivy_Obj_t * pObj;
    assert( !Ivy_IsComplement(pGhost) );
    assert( Ivy_ObjIsGhost(pGhost) );
    assert( Ivy_TableLookup(p, pGhost) == NULL );
    // get memory for the new object
    pObj = Ivy_ManFetchMemory( p );
    assert( Ivy_ObjIsNone(pObj) );
    pObj->Id = Vec_PtrSize(p->vObjs);
    Vec_PtrPush( p->vObjs, pObj );
    // add basic info (fanins, compls, type, init)
    pObj->Type = pGhost->Type;
    pObj->Init = pGhost->Init;
    // add connections
    Ivy_ObjConnect( p, pObj, pGhost->pFanin0, pGhost->pFanin1 );
    // compute level
    if ( Ivy_ObjIsNode(pObj) )
        pObj->Level = Ivy_ObjLevelNew(pObj);
    else if ( Ivy_ObjIsLatch(pObj) )
        pObj->Level = 0;
    else if ( Ivy_ObjIsOneFanin(pObj) )
        pObj->Level = Ivy_ObjFanin0(pObj)->Level;
    else if ( !Ivy_ObjIsPi(pObj) )
        assert( 0 );
    // create phase
    if ( Ivy_ObjIsNode(pObj) )
        pObj->fPhase = Ivy_ObjFaninPhase(Ivy_ObjChild0(pObj)) & Ivy_ObjFaninPhase(Ivy_ObjChild1(pObj));
    else if ( Ivy_ObjIsOneFanin(pObj) )
        pObj->fPhase = Ivy_ObjFaninPhase(Ivy_ObjChild0(pObj));
    // set the fail TFO flag
    if ( Ivy_ObjIsNode(pObj) )
        pObj->fFailTfo = Ivy_ObjFanin0(pObj)->fFailTfo | Ivy_ObjFanin1(pObj)->fFailTfo;
    // mark the fanins in a special way if the node is EXOR
    if ( Ivy_ObjIsExor(pObj) )
    {
        Ivy_ObjFanin0(pObj)->fExFan = 1;
        Ivy_ObjFanin1(pObj)->fExFan = 1;
    }
    // add PIs/POs to the arrays
    if ( Ivy_ObjIsPi(pObj) )
        Vec_PtrPush( p->vPis, pObj );
    else if ( Ivy_ObjIsPo(pObj) )
        Vec_PtrPush( p->vPos, pObj );
//    else if ( Ivy_ObjIsBuf(pObj) )
//        Vec_PtrPush( p->vBufs, pObj );
    if ( p->vRequired && Vec_IntSize(p->vRequired) <= pObj->Id )
        Vec_IntFillExtra( p->vRequired, 2 * Vec_IntSize(p->vRequired), 1000000 );
    // update node counters of the manager
    p->nObjs[Ivy_ObjType(pObj)]++;
    p->nCreated++;

//    printf( "Adding %sAIG node: ", p->pHaig==NULL? "H":" " );
//    Ivy_ObjPrintVerbose( p, pObj, p->pHaig==NULL );
//    printf( "\n" );

    // if HAIG is defined, create a corresponding node
    if ( p->pHaig )
        Ivy_ManHaigCreateObj( p, pObj );
    return pObj;
}